

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int vdbeMergeEngineStep(MergeEngine *pMerger,int *pbEof)

{
  uint uVar1;
  void *pvVar2;
  void *pKey2_00;
  uint *in_RSI;
  int *in_RDI;
  int iRes;
  u8 *pKey2;
  PmaReader *pReadr2;
  PmaReader *pReadr1;
  int i;
  SortSubtask *pTask;
  int iPrev;
  int rc;
  uint local_48;
  int local_44;
  undefined8 uVar3;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  SortSubtask *pTask_00;
  
  uVar1 = *(uint *)(*(long *)(in_RDI + 4) + 4);
  pTask_00 = *(SortSubtask **)(in_RDI + 2);
  local_48 = vdbePmaReaderNext((PmaReader *)
                               CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  if (local_48 == 0) {
    pvVar2 = (void *)(*(long *)(in_RDI + 6) + (long)(int)(uVar1 & 0xfffe) * 0x50);
    pKey2_00 = (void *)(*(long *)(in_RDI + 6) + (long)(int)(uVar1 | 1) * 0x50);
    uVar3 = *(undefined8 *)((long)pKey2_00 + 0x28);
    uVar1 = *in_RDI + uVar1;
    while (uVar1 = (int)uVar1 / 2, 0 < (int)uVar1) {
      if (*(long *)((long)pvVar2 + 0x18) == 0) {
        local_44 = 1;
      }
      else if (*(long *)((long)pKey2_00 + 0x18) == 0) {
        local_44 = -1;
      }
      else {
        local_44 = vdbeSorterCompare(pTask_00,(void *)CONCAT44(uVar1,in_stack_ffffffffffffffd8),
                                     (int)((ulong)pvVar2 >> 0x20),pKey2_00,
                                     (int)((ulong)uVar3 >> 0x20));
      }
      if ((local_44 < 0) || ((local_44 == 0 && (pvVar2 < pKey2_00)))) {
        *(int *)(*(long *)(in_RDI + 4) + (long)(int)uVar1 * 4) =
             (int)(((long)pvVar2 - *(long *)(in_RDI + 6)) / 0x50);
        pKey2_00 = (void *)(*(long *)(in_RDI + 6) +
                           (long)*(int *)(*(long *)(in_RDI + 4) + (long)(int)(uVar1 ^ 1) * 4) * 0x50
                           );
        uVar3 = *(undefined8 *)((long)pKey2_00 + 0x28);
      }
      else {
        if (*(long *)((long)pvVar2 + 0x18) != 0) {
          uVar3 = 0;
        }
        *(int *)(*(long *)(in_RDI + 4) + (long)(int)uVar1 * 4) =
             (int)(((long)pKey2_00 - *(long *)(in_RDI + 6)) / 0x50);
        pvVar2 = (void *)(*(long *)(in_RDI + 6) +
                         (long)*(int *)(*(long *)(in_RDI + 4) + (long)(int)(uVar1 ^ 1) * 4) * 0x50);
      }
    }
    *in_RSI = (uint)(*(long *)(*(long *)(in_RDI + 6) +
                               (long)*(int *)(*(long *)(in_RDI + 4) + 4) * 0x50 + 0x18) == 0);
  }
  if (local_48 == 0) {
    local_48 = (uint)pTask_00->pUnpacked->errCode;
  }
  return local_48;
}

Assistant:

static int vdbeMergeEngineStep(
  MergeEngine *pMerger,      /* The merge engine to advance to the next row */
  int *pbEof                 /* Set TRUE at EOF.  Set false for more content */
){
  int rc;
  int iPrev = pMerger->aTree[1];/* Index of PmaReader to advance */
  SortSubtask *pTask = pMerger->pTask;

  /* Advance the current PmaReader */
  rc = vdbePmaReaderNext(&pMerger->aReadr[iPrev]);

  /* Update contents of aTree[] */
  if( rc==SQLITE_OK ){
    int i;                      /* Index of aTree[] to recalculate */
    PmaReader *pReadr1;         /* First PmaReader to compare */
    PmaReader *pReadr2;         /* Second PmaReader to compare */
    u8 *pKey2;                  /* To pReadr2->aKey, or 0 if record cached */

    /* Find the first two PmaReaders to compare. The one that was just
    ** advanced (iPrev) and the one next to it in the array.  */
    pReadr1 = &pMerger->aReadr[(iPrev & 0xFFFE)];
    pReadr2 = &pMerger->aReadr[(iPrev | 0x0001)];
    pKey2 = pReadr2->aKey;

    for(i=(pMerger->nTree+iPrev)/2; i>0; i=i/2){
      /* Compare pReadr1 and pReadr2. Store the result in variable iRes. */
      int iRes;
      if( pReadr1->pFd==0 ){
        iRes = +1;
      }else if( pReadr2->pFd==0 ){
        iRes = -1;
      }else{
        iRes = vdbeSorterCompare(pTask, 
            pReadr1->aKey, pReadr1->nKey, pKey2, pReadr2->nKey
        );
      }

      /* If pReadr1 contained the smaller value, set aTree[i] to its index.
      ** Then set pReadr2 to the next PmaReader to compare to pReadr1. In this
      ** case there is no cache of pReadr2 in pTask->pUnpacked, so set
      ** pKey2 to point to the record belonging to pReadr2.
      **
      ** Alternatively, if pReadr2 contains the smaller of the two values,
      ** set aTree[i] to its index and update pReadr1. If vdbeSorterCompare()
      ** was actually called above, then pTask->pUnpacked now contains
      ** a value equivalent to pReadr2. So set pKey2 to NULL to prevent
      ** vdbeSorterCompare() from decoding pReadr2 again.
      **
      ** If the two values were equal, then the value from the oldest
      ** PMA should be considered smaller. The VdbeSorter.aReadr[] array
      ** is sorted from oldest to newest, so pReadr1 contains older values
      ** than pReadr2 iff (pReadr1<pReadr2).  */
      if( iRes<0 || (iRes==0 && pReadr1<pReadr2) ){
        pMerger->aTree[i] = (int)(pReadr1 - pMerger->aReadr);
        pReadr2 = &pMerger->aReadr[ pMerger->aTree[i ^ 0x0001] ];
        pKey2 = pReadr2->aKey;
      }else{
        if( pReadr1->pFd ) pKey2 = 0;
        pMerger->aTree[i] = (int)(pReadr2 - pMerger->aReadr);
        pReadr1 = &pMerger->aReadr[ pMerger->aTree[i ^ 0x0001] ];
      }
    }
    *pbEof = (pMerger->aReadr[pMerger->aTree[1]].pFd==0);
  }

  return (rc==SQLITE_OK ? pTask->pUnpacked->errCode : rc);
}